

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_d16_mask_w16_avx2
               (uint8_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m256i *m0,
               __m256i *v_round_offset,__m256i *v_maxval,int shift)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 (*in_RCX) [32];
  __m256i *in_RDX;
  __m256i *in_RSI;
  undefined8 *in_RDI;
  undefined1 (*in_R8) [32];
  undefined1 (*in_R9) [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  uint in_stack_00000008;
  __m256i res0;
  __m256i res0_hi;
  __m256i res0_lo;
  __m256i s1_0;
  __m256i s0_0;
  __m256i max_minus_m0;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  
  auVar1 = vpsubw_avx2(*in_R9,*in_RCX);
  auVar4 = auVar1;
  yy_loadu_256(in_RSI,in_RSI);
  auVar5 = auVar4;
  yy_loadu_256(in_RDX,in_RSI);
  auVar2 = vpunpcklwd_avx2(auVar4,auVar5);
  auVar3 = vpunpcklwd_avx2(*in_RCX,auVar1);
  auVar2 = vpmaddwd_avx2(auVar2,auVar3);
  auVar3 = vpunpckhwd_avx2(auVar4,auVar5);
  auVar1 = vpunpckhwd_avx2(*in_RCX,auVar1);
  auVar1 = vpmaddwd_avx2(auVar3,auVar1);
  auVar2 = vpsubd_avx2(auVar2,*in_R8);
  auVar2 = vpsrad_avx2(auVar2,ZEXT416(in_stack_00000008));
  auVar1 = vpsubd_avx2(auVar1,*in_R8);
  auVar1 = vpsrad_avx2(auVar1,ZEXT416(in_stack_00000008));
  auVar2 = vpackssdw_avx2(auVar2,auVar1);
  auVar2 = vpackuswb_avx2(auVar2,auVar2);
  auVar2 = vpermq_avx2(auVar2,0xd8);
  local_4e0 = auVar2._0_8_;
  uStack_4d8 = auVar2._8_8_;
  *in_RDI = local_4e0;
  in_RDI[1] = uStack_4d8;
  return;
}

Assistant:

static inline void blend_a64_d16_mask_w16_avx2(
    uint8_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m256i *m0, const __m256i *v_round_offset, const __m256i *v_maxval,
    int shift) {
  const __m256i max_minus_m0 = _mm256_sub_epi16(*v_maxval, *m0);
  const __m256i s0_0 = yy_loadu_256(src0);
  const __m256i s1_0 = yy_loadu_256(src1);
  __m256i res0_lo = _mm256_madd_epi16(_mm256_unpacklo_epi16(s0_0, s1_0),
                                      _mm256_unpacklo_epi16(*m0, max_minus_m0));
  __m256i res0_hi = _mm256_madd_epi16(_mm256_unpackhi_epi16(s0_0, s1_0),
                                      _mm256_unpackhi_epi16(*m0, max_minus_m0));
  res0_lo =
      _mm256_srai_epi32(_mm256_sub_epi32(res0_lo, *v_round_offset), shift);
  res0_hi =
      _mm256_srai_epi32(_mm256_sub_epi32(res0_hi, *v_round_offset), shift);
  const __m256i res0 = _mm256_packs_epi32(res0_lo, res0_hi);
  __m256i res = _mm256_packus_epi16(res0, res0);
  res = _mm256_permute4x64_epi64(res, 0xd8);
  _mm_storeu_si128((__m128i *)(dst), _mm256_castsi256_si128(res));
}